

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O3

ALLEGRO_USTR * al_fget_ustr(ALLEGRO_FILE *f)

{
  _Bool _Var1;
  char *pcVar2;
  ALLEGRO_USTR *us;
  char buf [128];
  char acStack_a8 [136];
  
  pcVar2 = al_fgets(f,acStack_a8,0x80);
  if (pcVar2 == (char *)0x0) {
    us = (ALLEGRO_USTR *)0x0;
  }
  else {
    us = al_ustr_new("");
    do {
      al_ustr_append_cstr(us,acStack_a8);
      _Var1 = al_ustr_has_suffix_cstr(us,"\n");
      if (_Var1) {
        return us;
      }
      pcVar2 = al_fgets(f,acStack_a8,0x80);
    } while (pcVar2 != (char *)0x0);
  }
  return us;
}

Assistant:

ALLEGRO_USTR *al_fget_ustr(ALLEGRO_FILE *f)
{
   ALLEGRO_USTR *us;
   char buf[128];

   if (!al_fgets(f, buf, sizeof(buf))) {
      return NULL;
   }

   us = al_ustr_new("");

   do {
      al_ustr_append_cstr(us, buf);
      if (al_ustr_has_suffix_cstr(us, "\n"))
         break;
   } while (al_fgets(f, buf, sizeof(buf)));

   return us;
}